

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.h
# Opt level: O0

int __thiscall imrt::Station::get_nb_apertures(Station *this,string *strategy)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long in_RDI;
  char *in_stack_ffffffffffffffc8;
  undefined4 local_4;
  
  bVar1 = std::operator==(in_RSI,in_stack_ffffffffffffffc8);
  if (bVar1) {
    sVar2 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 200));
    local_4 = (int)sVar2;
  }
  else {
    bVar1 = std::operator==(in_RSI,in_stack_ffffffffffffffc8);
    if (bVar1) {
      sVar3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::size
                        ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                          *)0x1168eb);
      local_4 = (int)sVar3;
    }
    else {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

int get_nb_apertures(string strategy){
    if(strategy=="dao_ls")
       return (intensity.size());
    else if(strategy=="ibo_ls")
       return (int2nb.size());
    return(-1);
  }